

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTOpenGlider.cpp
# Opt level: O1

bool __thiscall OpenGliderConnection::APRSProcessData(OpenGliderConnection *this,char *buffer)

{
  string *psVar1;
  bool bVar2;
  long lVar3;
  bool bVar4;
  float fVar5;
  string local_50;
  
  LTOnlineChannel::DebugLogRaw((LTOnlineChannel *)this,buffer,-2,true);
  psVar1 = &this->aprsData;
  std::__cxx11::string::append((char *)psVar1);
  if ((this->aprsData)._M_string_length == 0) {
    bVar4 = true;
  }
  else {
    fVar5 = DataRefs::GetMiscNetwTime(&dataRefs);
    this->aprsLastData = fVar5;
    (*(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel._vptr_LTChannel[9])
              (this);
    lVar3 = std::__cxx11::string::find((char *)psVar1,0x24909a,0);
    bVar4 = lVar3 == -1;
    if (!bVar4) {
      do {
        std::__cxx11::string::substr((ulong)&local_50,(ulong)psVar1);
        bVar2 = APRSProcessLine(this,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if (!bVar2) {
          return bVar4;
        }
        std::__cxx11::string::erase((ulong)psVar1,0);
        lVar3 = std::__cxx11::string::find((char *)psVar1,0x24909a,0);
        bVar4 = lVar3 == -1;
      } while (!bVar4);
    }
  }
  return bVar4;
}

Assistant:

bool OpenGliderConnection::APRSProcessData (const char* buffer)
{
    // save the data to our processing buffer
    DebugLogRaw(buffer, HTTP_FLAG_UDP);
    aprsData += buffer;
    if (aprsData.empty())            // weird...but not an error if there's nothing to process
        return true;
    
    // So we just received something
    aprsLastData = dataRefs.GetMiscNetwTime();
    DecErrCnt();

    // process the input line by line, expected a line to be ended by \r\n
    // (If CR/LF is yet missing then the received data is yet incomplete and will be completed with the next received data)
    for (size_t lnEnd = aprsData.find("\r\n");
         lnEnd != std::string::npos;
         aprsData.erase(0,lnEnd+2), lnEnd = aprsData.find("\r\n"))
    {
        if (!APRSProcessLine(aprsData.substr(0,lnEnd)))
            return false;
    }
    return true;
}